

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnBrTableExpr
          (BinaryReaderObjdumpDisassemble *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  char *pcVar1;
  undefined8 uVar2;
  string local_98;
  string local_78;
  uint local_54;
  string local_50 [4];
  Index i;
  string buffer;
  Index default_target_depth_local;
  Index *target_depths_local;
  Index num_targets_local;
  BinaryReaderObjdumpDisassemble *this_local;
  
  buffer.field_2._12_4_ = default_target_depth;
  if ((this->in_function_body & 1U) == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    std::__cxx11::string::string(local_50);
    for (local_54 = 0; local_54 < num_targets; local_54 = local_54 + 1) {
      std::__cxx11::to_string(&local_78,target_depths[local_54]);
      pcVar1 = (char *)std::__cxx11::string::append(local_50);
      std::__cxx11::string::append(pcVar1);
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::__cxx11::to_string(&local_98,buffer.field_2._12_4_);
    std::__cxx11::string::append(local_50);
    std::__cxx11::string::~string((string *)&local_98);
    uVar2 = std::__cxx11::string::c_str();
    LogOpcode(this,"%s",uVar2);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    std::__cxx11::string::~string(local_50);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnBrTableExpr(
    Index num_targets,
    Index* target_depths,
    Index default_target_depth) {
  if (!in_function_body) {
    return Result::Ok;
  }

  std::string buffer = std::string();
  for (Index i = 0; i < num_targets; i++) {
    buffer.append(std::to_string(target_depths[i])).append(" ");
  }
  buffer.append(std::to_string(default_target_depth));

  LogOpcode("%s", buffer.c_str());
  return Result::Ok;
}